

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mdef.c
# Opt level: O1

void mdef_sseq2sen_active(mdef_t *mdef,uint8 *sseq,uint8 *sen)

{
  s3senid_t *psVar1;
  long lVar2;
  long lVar3;
  
  if (0 < mdef->n_sseq) {
    lVar2 = 0;
    do {
      if ((sseq[lVar2] != '\0') && (0 < mdef->n_emit_state)) {
        psVar1 = mdef->sseq[lVar2];
        lVar3 = 0;
        do {
          sen[psVar1[lVar3]] = '\x01';
          lVar3 = lVar3 + 1;
        } while (lVar3 < mdef->n_emit_state);
      }
      lVar2 = lVar2 + 1;
    } while (lVar2 < mdef->n_sseq);
  }
  return;
}

Assistant:

void
mdef_sseq2sen_active(mdef_t * mdef, uint8 * sseq, uint8 * sen)
{
    int32 ss, i;
    s3senid_t *sp;

    for (ss = 0; ss < mdef_n_sseq(mdef); ss++) {
        if (sseq[ss]) {
            sp = mdef->sseq[ss];
            for (i = 0; i < mdef_n_emit_state(mdef); i++)
                sen[sp[i]] = 1;
        }
    }
}